

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O3

bool __thiscall RTIMUGD20M303DLHC::setAccelCTRL1(RTIMUGD20M303DLHC *this)

{
  int iVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  iVar1 = this_00->m_GD20M303DLHCAccelSampleRate;
  if (0xfffffff8 < iVar1 - 8U) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelSlaveAddr,' ',
                               (char)iVar1 << 4 | 7,"Failed to set LSM303D CTRL1");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM303DLHC accel sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20M303DLHC::setAccelCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_GD20M303DLHCAccelSampleRate < 1) || (m_settings->m_GD20M303DLHCAccelSampleRate > 7)) {
        HAL_ERROR1("Illegal LSM303DLHC accel sample rate code %d\n", m_settings->m_GD20M303DLHCAccelSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_GD20M303DLHCAccelSampleRate << 4) | 0x07;

    return m_settings->HALWrite(m_accelSlaveAddr,  LSM303DLHC_CTRL1_A, ctrl1, "Failed to set LSM303D CTRL1");
}